

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall
cmGeneratorTarget::DiscoverSyntheticTargets
          (cmGeneratorTarget *this,cmSyntheticTargetCache *cache,string *config)

{
  cmTarget *tgt_00;
  cmMakefile *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>_>
  *pmVar1;
  cmSyntheticTargetCache *cache_00;
  __single_object _Var2;
  pointer pbVar3;
  pointer pcVar4;
  bool bVar5;
  mapped_type *pmVar6;
  string *psVar7;
  iterator iVar8;
  cmFileSet *fs;
  __uniq_ptr_data<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>,_true,_true> *p_Var9;
  mapped_type *this_01;
  pointer pcVar10;
  pointer name;
  string_view input;
  string_view input_00;
  pair<cmFileSet_*,_bool> pVar11;
  char local_211;
  cmTarget *tgt;
  cmGeneratorTarget *gt;
  cmGeneratorTarget *synthDep;
  string *local_1f8;
  cmSyntheticTargetCache *local_1f0;
  unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> local_1e8;
  cmLocalGenerator *lg;
  __single_object gtp;
  cmCryptoHash hasher;
  string targetName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fsNames;
  cmCxxModuleUsageEffects usage;
  string safeName;
  string dirhash;
  string targetIdent;
  cmOptionalLinkImplementation impl;
  
  impl.super_cmLinkImplementation.LanguageRuntimeLibraries._M_h._M_buckets =
       &impl.super_cmLinkImplementation.LanguageRuntimeLibraries._M_h._M_single_bucket;
  impl.super_cmLinkImplementation.super_cmLinkImplementationLibraries.WrongConfigLibraries.
  super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 0;
  impl.super_cmLinkImplementation.super_cmLinkImplementationLibraries._65_8_ = 0;
  impl.super_cmLinkImplementation.super_cmLinkImplementationLibraries.WrongConfigLibraries.
  super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  impl.super_cmLinkImplementation.super_cmLinkImplementationLibraries.WrongConfigLibraries.
  super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = 0;
  impl.super_cmLinkImplementation.super_cmLinkImplementationLibraries.WrongConfigLibraries.
  super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.super__Vector_impl_data.
  _M_finish._1_7_ = 0;
  impl.super_cmLinkImplementation.super_cmLinkImplementationLibraries.Objects.
  super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  impl.super_cmLinkImplementation.super_cmLinkImplementationLibraries.Objects.
  super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  impl.super_cmLinkImplementation.super_cmLinkImplementationLibraries.Libraries.
  super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  impl.super_cmLinkImplementation.super_cmLinkImplementationLibraries.Objects.
  super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  impl.super_cmLinkImplementation.super_cmLinkImplementationLibraries.Libraries.
  super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  impl.super_cmLinkImplementation.super_cmLinkImplementationLibraries.Libraries.
  super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  impl.super_cmLinkImplementation.Languages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  impl.super_cmLinkImplementation.Languages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  impl.super_cmLinkImplementation.Languages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  impl.super_cmLinkImplementation.LanguageRuntimeLibraries._M_h._M_bucket_count = 1;
  impl.super_cmLinkImplementation.LanguageRuntimeLibraries._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)0x0;
  impl.super_cmLinkImplementation.LanguageRuntimeLibraries._M_h._M_element_count = 0;
  impl.super_cmLinkImplementation.LanguageRuntimeLibraries._M_h._M_rehash_policy._M_max_load_factor
       = 1.0;
  impl.super_cmLinkImplementation.LanguageRuntimeLibraries._M_h._M_rehash_policy._M_next_resize = 0;
  impl.super_cmLinkImplementation.LanguageRuntimeLibraries._M_h._M_single_bucket =
       (__node_base_ptr)0x0;
  impl.super_cmLinkImplementation.HadLinkLanguageSensitiveCondition = false;
  impl.super_cmLinkImplementation._161_3_ = 0;
  local_1f8 = config;
  ComputeLinkImplementationLibraries(this,config,&impl,this,Link);
  cmCxxModuleUsageEffects::cmCxxModuleUsageEffects(&usage,this);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::InfoByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::InfoByConfig>_>_>
           ::operator[](&this->Configs,local_1f8);
  pcVar4 = impl.super_cmLinkImplementation.super_cmLinkImplementationLibraries.Libraries.
           super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pmVar1 = &cache->CxxModuleTargets;
  local_1f0 = cache;
  for (pcVar10 = impl.super_cmLinkImplementation.super_cmLinkImplementationLibraries.Libraries.
                 super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                 super__Vector_impl_data._M_start; pcVar10 != pcVar4; pcVar10 = pcVar10 + 1) {
    gt = (pcVar10->super_cmLinkItem).Target;
    if (gt != (cmGeneratorTarget *)0x0) {
      bVar5 = IsImported(gt);
      if (bVar5) {
        bVar5 = HaveCxx20ModuleSources(gt,(string *)0x0);
        if (bVar5) {
          cmCryptoHash::cmCryptoHash(&hasher,AlgoSHA3_512);
          psVar7 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(gt->LocalGenerator);
          input._M_str = (psVar7->_M_dataplus)._M_p;
          input._M_len = psVar7->_M_string_length;
          cmCryptoHash::HashString_abi_cxx11_(&dirhash,&hasher,input);
          psVar7 = GetName_abi_cxx11_(gt);
          std::__cxx11::string::string((string *)&safeName,(string *)psVar7);
          cmsys::SystemTools::ReplaceString(&safeName,":","_");
          psVar7 = cmCxxModuleUsageEffects::GetHash_abi_cxx11_(&usage);
          cmStrCat<char_const(&)[4],std::__cxx11::string&,char_const(&)[4],std::__cxx11::string_const&>
                    (&targetName,(char (*) [4])"@d_",&dirhash,(char (*) [4])"@u_",psVar7);
          input_00._M_str = targetName._M_dataplus._M_p;
          input_00._M_len = targetName._M_string_length;
          cmCryptoHash::HashString_abi_cxx11_(&targetIdent,&hasher,input_00);
          std::__cxx11::string::~string((string *)&targetName);
          std::__cxx11::string::substr((ulong)&gtp,(ulong)&targetIdent);
          cmStrCat<std::__cxx11::string&,char_const(&)[8],std::__cxx11::string>
                    (&targetName,&safeName,(char (*) [8])"@synth_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtp);
          std::__cxx11::string::~string((string *)&gtp);
          iVar8 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>_>
                          *)cache,&targetName);
          synthDep = (cmGeneratorTarget *)0x0;
          if ((_Rb_tree_header *)iVar8._M_node == &(pmVar1->_M_t)._M_impl.super__Rb_tree_header) {
            tgt_00 = gt->Target;
            this_00 = gt->Makefile;
            lg = gt->LocalGenerator;
            tgt = cmMakefile::AddSynthesizedTarget(this_00,INTERFACE_LIBRARY,&targetName);
            cmTarget::CopyPolicyStatuses(tgt,tgt_00);
            cmTarget::GetAllFileSetNames_abi_cxx11_(&fsNames,tgt_00);
            pbVar3 = fsNames.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (name = fsNames.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start; name != pbVar3; name = name + 1)
            {
              fs = cmTarget::GetFileSet(tgt_00,name);
              if (fs == (cmFileSet *)0x0) {
                psVar7 = cmTarget::GetName_abi_cxx11_(tgt);
                local_211 = '\'';
                cmStrCat<char_const(&)[32],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string_const&,char>
                          ((string *)&gtp,(char (*) [32])"Failed to find file set named \'",name,
                           (char (*) [14])"\' on target \'",psVar7,&local_211);
                cmMakefile::IssueMessage(this_00,INTERNAL_ERROR,(string *)&gtp);
                std::__cxx11::string::~string((string *)&gtp);
              }
              else {
                pVar11 = cmTarget::GetOrCreateFileSet(tgt,&fs->Name,&fs->Type,fs->Visibility);
                cmFileSet::CopyEntries(pVar11.first,fs);
              }
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&fsNames);
            cmTarget::CopyImportedCxxModulesEntries(tgt,tgt_00);
            cmTarget::CopyImportedCxxModulesProperties(tgt,tgt_00);
            cmCxxModuleUsageEffects::ApplyToTarget(&usage,tgt);
            std::make_unique<cmGeneratorTarget,cmTarget*&,cmLocalGenerator*&>
                      ((cmTarget **)&gtp,(cmLocalGenerator **)&tgt);
            _Var2 = gtp;
            cache_00 = local_1f0;
            synthDep = (cmGeneratorTarget *)
                       gtp._M_t.
                       super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                       .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl;
            p_Var9 = (__uniq_ptr_data<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>,_true,_true>
                      *)std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>_>
                        ::operator[](&local_1f0->CxxModuleTargets,&targetName);
            p_Var9->
            super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> =
                 (__uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>)
                 _Var2._M_t.
                 super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                 .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl;
            DiscoverSyntheticTargets
                      ((cmGeneratorTarget *)
                       gtp._M_t.
                       super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                       .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl,cache_00,
                       local_1f8);
            local_1e8._M_t.
            super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>._M_t.
            super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>.
            super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl =
                 gtp._M_t.
                 super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                 .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl;
            gtp._M_t.
            super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>._M_t.
            super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>.
            super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl =
                 (__uniq_ptr_data<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>,_true,_true>
                  )(__uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>)0x0;
            cmLocalGenerator::AddGeneratorTarget(lg,&local_1e8);
            std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::~unique_ptr
                      (&local_1e8);
            std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::~unique_ptr
                      (&gtp);
            cache = local_1f0;
          }
          else {
            synthDep = *(cmGeneratorTarget **)(iVar8._M_node + 2);
          }
          this_01 = std::
                    map<const_cmGeneratorTarget_*,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
                    ::operator[](&pmVar6->SyntheticDeps,&gt);
          std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
          push_back(this_01,&synthDep);
          std::__cxx11::string::~string((string *)&targetName);
          std::__cxx11::string::~string((string *)&targetIdent);
          std::__cxx11::string::~string((string *)&safeName);
          std::__cxx11::string::~string((string *)&dirhash);
          cmCryptoHash::~cmCryptoHash(&hasher);
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)&usage);
  cmLinkImplementation::~cmLinkImplementation(&impl.super_cmLinkImplementation);
  return true;
}

Assistant:

bool cmGeneratorTarget::DiscoverSyntheticTargets(cmSyntheticTargetCache& cache,
                                                 std::string const& config)
{
  cmOptionalLinkImplementation impl;
  this->ComputeLinkImplementationLibraries(config, impl, this,
                                           LinkInterfaceFor::Link);

  cmCxxModuleUsageEffects usage(this);

  auto& SyntheticDeps = this->Configs[config].SyntheticDeps;

  for (auto const& entry : impl.Libraries) {
    auto const* gt = entry.Target;
    if (!gt || !gt->IsImported()) {
      continue;
    }

    if (gt->HaveCxx20ModuleSources()) {
      cmCryptoHash hasher(cmCryptoHash::AlgoSHA3_512);
      constexpr size_t HASH_TRUNCATION = 12;
      auto dirhash = hasher.HashString(
        gt->GetLocalGenerator()->GetCurrentBinaryDirectory());
      std::string safeName = gt->GetName();
      cmSystemTools::ReplaceString(safeName, ":", "_");
      auto targetIdent =
        hasher.HashString(cmStrCat("@d_", dirhash, "@u_", usage.GetHash()));
      std::string targetName =
        cmStrCat(safeName, "@synth_", targetIdent.substr(0, HASH_TRUNCATION));

      // Check the cache to see if this instance of the imported target has
      // already been created.
      auto cached = cache.CxxModuleTargets.find(targetName);
      cmGeneratorTarget const* synthDep = nullptr;
      if (cached == cache.CxxModuleTargets.end()) {
        auto const* model = gt->Target;
        auto* mf = gt->Makefile;
        auto* lg = gt->GetLocalGenerator();
        auto* tgt = mf->AddSynthesizedTarget(cmStateEnums::INTERFACE_LIBRARY,
                                             targetName);

        // Copy relevant information from the existing IMPORTED target.

        // Copy policies to the target.
        tgt->CopyPolicyStatuses(model);

        // Copy file sets.
        {
          auto fsNames = model->GetAllFileSetNames();
          for (auto const& fsName : fsNames) {
            auto const* fs = model->GetFileSet(fsName);
            if (!fs) {
              mf->IssueMessage(MessageType::INTERNAL_ERROR,
                               cmStrCat("Failed to find file set named '",
                                        fsName, "' on target '",
                                        tgt->GetName(), '\''));
              continue;
            }
            auto* newFs = tgt
                            ->GetOrCreateFileSet(fs->GetName(), fs->GetType(),
                                                 fs->GetVisibility())
                            .first;
            newFs->CopyEntries(fs);
          }
        }

        // Copy imported C++ module properties.
        tgt->CopyImportedCxxModulesEntries(model);

        // Copy other properties which may affect the C++ module BMI
        // generation.
        tgt->CopyImportedCxxModulesProperties(model);

        // Apply usage requirements to the target.
        usage.ApplyToTarget(tgt);

        // Create the generator target and attach it to the local generator.
        auto gtp = cm::make_unique<cmGeneratorTarget>(tgt, lg);
        synthDep = gtp.get();
        cache.CxxModuleTargets[targetName] = synthDep;
        gtp->DiscoverSyntheticTargets(cache, config);
        lg->AddGeneratorTarget(std::move(gtp));
      } else {
        synthDep = cached->second;
      }

      SyntheticDeps[gt].push_back(synthDep);
    }
  }

  return true;
}